

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O1

void xcb_input_add_master_next(xcb_input_add_master_iterator_t *i)

{
  ushort uVar1;
  xcb_input_add_master_t *_aux;
  uint uVar2;
  
  uVar1 = i->data->name_len;
  uVar2 = -(uint)uVar1 & 3;
  i->index = uVar1 + uVar2 + 8;
  i->rem = i->rem + -1;
  i->data = (xcb_input_add_master_t *)((long)&i->data[1].type + (ulong)(uVar1 + uVar2));
  return;
}

Assistant:

void
xcb_input_add_master_next (xcb_input_add_master_iterator_t *i)
{
    xcb_input_add_master_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_add_master_t *)(((char *)R) + xcb_input_add_master_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_add_master_t *) child.data;
}